

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::loadClusive
          (AbstractNumericFacetValidator *this,XSerializeEngine *serEng,bool *inherited,
          XMLNumber **data,NumberType numType,int flag)

{
  DatatypeValidator *pDVar1;
  XMLNumber *pXVar2;
  XSerializeEngine *serEng_00;
  
  XSerializeEngine::operator>>(serEng,inherited);
  if (*inherited == false) {
    pXVar2 = XMLNumber::loadNumber((XMLNumber *)(ulong)numType,(NumberType)serEng,serEng_00);
  }
  else {
    if (3 < flag - 1U) {
      return;
    }
    pDVar1 = (this->super_DatatypeValidator).fBaseValidator;
    switch(flag) {
    case 1:
      pXVar2 = *(XMLNumber **)&pDVar1[1].fAnonymous;
      break;
    case 2:
      pXVar2 = *(XMLNumber **)&pDVar1[1].fFinalSet;
      break;
    case 3:
      pXVar2 = *(XMLNumber **)&pDVar1[1].fFixed;
      break;
    case 4:
      pXVar2 = *(XMLNumber **)&pDVar1[1].fOrdered;
    }
  }
  *data = pXVar2;
  return;
}

Assistant:

void AbstractNumericFacetValidator::loadClusive(XSerializeEngine&       serEng
                                              , bool&                   inherited
                                              , XMLNumber*&             data
                                              , XMLNumber::NumberType   numType
                                              , int                     flag)
{
    serEng>>inherited;

    if (!inherited)
        data = XMLNumber::loadNumber(numType, serEng);
    else
    {
        AbstractNumericFacetValidator* basedv = (AbstractNumericFacetValidator*) getBaseValidator();

        switch(flag)
        {
        case 1: 
            data = basedv->getMaxInclusive();
            break;
        case 2:
            data = basedv->getMaxExclusive();
            break;
        case 3:
            data = basedv->getMinInclusive();
            break;
        case 4:
            data = basedv->getMinExclusive();
            break;
        default:
            break;
        }

    }

}